

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getDatatypeValidator
          (TraverseSchema *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  XMLBuffer *this_00;
  bool bVar1;
  int iVar2;
  DatatypeValidator *pDVar3;
  Grammar *pGVar4;
  DatatypeValidatorFactory *this_01;
  
  bVar1 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  if (bVar1) {
    this_01 = this->fDatatypeRegistry;
  }
  else {
    this_00 = &this->fBuffer;
    XMLBuffer::set(this_00,uriStr);
    XMLBuffer::append(this_00,L',');
    XMLBuffer::append(this_00,localPartStr);
    if (uriStr != (XMLCh *)0x0) {
      bVar1 = XMLString::equals(uriStr,this->fTargetNSURIString);
      if (!bVar1) {
        pGVar4 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
        if (pGVar4 != (Grammar *)0x0) {
          iVar2 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])(pGVar4);
          if (iVar2 == 1) {
            localPartStr = (this->fBuffer).fBuffer;
            localPartStr[(this->fBuffer).fIndex] = L'\0';
            this_01 = (DatatypeValidatorFactory *)(pGVar4 + 0xf);
            goto LAB_0031dcd1;
          }
        }
        return (DatatypeValidator *)0x0;
      }
    }
    localPartStr = (this->fBuffer).fBuffer;
    this_01 = this->fDatatypeRegistry;
    localPartStr[(this->fBuffer).fIndex] = L'\0';
  }
LAB_0031dcd1:
  pDVar3 = DatatypeValidatorFactory::getDatatypeValidator(this_01,localPartStr);
  return pDVar3;
}

Assistant:

DatatypeValidator*
TraverseSchema::getDatatypeValidator(const XMLCh* const uriStr,
                                     const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        dv = fDatatypeRegistry->getDatatypeValidator(localPartStr);
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPartStr);

        if ((uriStr) && !XMLString::equals(uriStr, fTargetNSURIString)) {

            Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

            if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {
                dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(fBuffer.getRawBuffer());
            }
        }
        else {
            dv = fDatatypeRegistry->getDatatypeValidator(fBuffer.getRawBuffer());
        }
    }

    return dv;
}